

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

tuple __thiscall
pybind11::
make_tuple<(pybind11::return_value_policy)1,pybind11::handle,pybind11::handle,pybind11::none,pybind11::str>
          (pybind11 *this,handle *args_,handle *args__1,none *args__2,str *args__3)

{
  string *psVar1;
  PyObject *pPVar2;
  undefined8 uVar3;
  long *plVar4;
  cast_error *this_00;
  long lVar5;
  string *name;
  undefined1 local_100 [8];
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
  argtypes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  array<pybind11::object,_4UL> args;
  
  pPVar2 = args_->m_ptr;
  if (pPVar2 == (PyObject *)0x0) {
    local_40 = (undefined1  [8])0x0;
  }
  else {
    pPVar2->ob_refcnt = pPVar2->ob_refcnt + 1;
    local_40 = (undefined1  [8])args_->m_ptr;
  }
  pPVar2 = args__1->m_ptr;
  if (pPVar2 == (PyObject *)0x0) {
    args._M_elems[0].super_handle.m_ptr = (handle)(PyObject *)0x0;
  }
  else {
    pPVar2->ob_refcnt = pPVar2->ob_refcnt + 1;
    args._M_elems[0].super_handle.m_ptr = (handle)args__1->m_ptr;
  }
  pPVar2 = (args__2->super_object).super_handle.m_ptr;
  if (pPVar2 == (PyObject *)0x0) {
    args._M_elems[1].super_handle.m_ptr = (handle)(PyObject *)0x0;
  }
  else {
    pPVar2->ob_refcnt = pPVar2->ob_refcnt + 1;
    args._M_elems[1].super_handle.m_ptr = (handle)(args__2->super_object).super_handle.m_ptr;
  }
  pPVar2 = (args__3->super_object).super_handle.m_ptr;
  if (pPVar2 == (PyObject *)0x0) {
    args._M_elems[2].super_handle.m_ptr = (handle)(PyObject *)0x0;
  }
  else {
    pPVar2->ob_refcnt = pPVar2->ob_refcnt + 1;
    args._M_elems[2].super_handle.m_ptr = (handle)(args__3->super_object).super_handle.m_ptr;
  }
  plVar4 = (long *)local_40;
  lVar5 = 0;
  while( true ) {
    if (lVar5 == -0x80) {
      tuple::tuple((tuple *)this,4);
      lVar5 = 0;
      while( true ) {
        if (lVar5 == 0x20) {
          std::array<pybind11::object,_4UL>::~array((array<pybind11::object,_4UL> *)local_40);
          return (object)(object)this;
        }
        uVar3 = *(undefined8 *)((long)(args._M_elems + -1) + lVar5);
        *(undefined8 *)((long)(args._M_elems + -1) + lVar5) = 0;
        if ((*(byte *)(*(long *)(*(long *)this + 8) + 0xab) & 4) == 0) break;
        *(undefined8 *)(*(long *)this + 0x18 + lVar5) = uVar3;
        lVar5 = lVar5 + 8;
      }
      __assert_fail("PyTuple_Check(result.ptr())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CRPropa[P]sophia_next/lib/pybind11/include/pybind11/cast.h"
                    ,0x722,
                    "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <pybind11::handle, pybind11::handle, pybind11::none, pybind11::str>]"
                   );
    }
    if (*plVar4 == 0) break;
    lVar5 = lVar5 + -0x20;
    plVar4 = plVar4 + 1;
  }
  type_id<pybind11::handle>();
  type_id<pybind11::handle>();
  psVar1 = (string *)(argtypes._M_elems[1].field_2._M_local_buf + 8);
  std::__cxx11::string::string((string *)psVar1,"N8pybind114noneE",(allocator *)&local_60);
  detail::clean_type_id(psVar1);
  psVar1 = (string *)(argtypes._M_elems[2].field_2._M_local_buf + 8);
  std::__cxx11::string::string((string *)psVar1,"N8pybind113strE",(allocator *)&local_60);
  detail::clean_type_id(psVar1);
  this_00 = (cast_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&argtypes._M_elems[3].field_2 + 8),
                 "make_tuple(): unable to convert argument of type \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_100 + -lVar5));
  std::operator+(&local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&argtypes._M_elems[3].field_2 + 8),"\' to Python object");
  cast_error::runtime_error(this_00,&local_60);
  __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error("make_tuple(): unable to convert argument of type '" +
                argtypes[i] + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}